

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Glucose::Solver::rebuildOrderHeap(Solver *this)

{
  bool bVar1;
  lbool local_3d;
  int local_3c;
  vec<int> vs;
  
  vs.data = (int *)0x0;
  vs.sz = 0;
  vs.cap = 0;
  for (local_3c = 0; local_3c < (this->vardata).sz; local_3c = local_3c + 1) {
    if ((this->decision).data[local_3c] != '\0') {
      local_3d.value = (this->assigns).data[local_3c].value;
      bVar1 = lbool::operator==(&local_3d,(lbool)0x2);
      if (bVar1) {
        vec<int>::push(&vs,&local_3c);
      }
    }
  }
  Heap<Glucose::Solver::VarOrderLt>::build(&this->order_heap,&vs);
  vec<int>::~vec(&vs);
  return;
}

Assistant:

void Solver::rebuildOrderHeap() {
    vec <Var> vs;
    for(Var v = 0; v < nVars(); v++)
        if(decision[v] && value(v) == l_Undef)
            vs.push(v);
    order_heap.build(vs);

}